

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdLen<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags flags;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  ThreadContext *this_00;
  Var pvVar5;
  Var length;
  Var instance;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  if (playout ==
      (OpLayoutDynamicProfile<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x21f0,"(playout)","playout");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar4);
  flags = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  pvVar5 = GetReg<unsigned_char>
                     (this,(playout->
                           super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                           Instance);
  pSVar4 = GetScriptContext(this);
  pvVar5 = Js::JavascriptOperators::OP_GetLength(pvVar5,pSVar4);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags);
  SetReg<unsigned_char>
            (this,(playout->super_OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                  Value,pvVar5);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdLen(const unaligned T * const playout)
    {
        Assert(playout);

        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        Var instance = GetReg(playout->Instance);
        Var length = JavascriptOperators::OP_GetLength(instance, GetScriptContext());

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

        SetReg(playout->Value, length);
    }